

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afhints.c
# Opt level: O1

FT_Error af_glyph_hints_reload(AF_GlyphHints hints,FT_Outline *outline)

{
  FT_Short *pFVar1;
  FT_Short *pFVar2;
  char cVar3;
  int iVar4;
  FT_Memory memory;
  FT_Fixed FVar5;
  FT_Fixed FVar6;
  FT_Vector *pFVar7;
  FT_Pos FVar8;
  FT_Pos FVar9;
  FT_Orientation FVar10;
  uint uVar11;
  FT_Int FVar12;
  AF_Point_conflict *ppAVar13;
  AF_Point_conflict pAVar14;
  AF_Point_conflict pAVar15;
  AF_Point pAVar16;
  AF_Point_conflict *ppAVar17;
  AF_Point_conflict pAVar18;
  short *psVar19;
  long lVar20;
  AF_Point pAVar21;
  long lVar22;
  byte bVar23;
  FT_Vector *pFVar24;
  short sVar25;
  long lVar26;
  byte *pbVar27;
  FT_UShort FVar28;
  uint uVar29;
  long lVar30;
  int iVar31;
  uint uVar32;
  AF_Point_conflict pAVar33;
  uint uVar34;
  AF_Point_conflict pAVar35;
  long lVar36;
  bool bVar37;
  FT_Error error;
  FT_Error local_7c;
  FT_Outline *local_78;
  AF_Point_conflict local_70;
  AF_Point_conflict *local_68;
  ulong local_60;
  AF_Point_conflict local_58;
  FT_Pos local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_7c = 0;
  memory = hints->memory;
  FVar5 = hints->x_scale;
  FVar6 = hints->y_scale;
  local_68 = (AF_Point_conflict *)hints->x_delta;
  local_50 = hints->y_delta;
  hints->num_points = 0;
  hints->num_contours = 0;
  hints->axis[0].num_segments = 0;
  hints->axis[0].num_edges = 0;
  hints->axis[1].num_segments = 0;
  hints->axis[1].num_edges = 0;
  uVar32 = (uint)outline->n_contours;
  local_78 = outline;
  if (uVar32 < 9) {
    if (hints->contours == (AF_Point_conflict *)0x0) {
      hints->contours = (hints->embedded).contours;
      uVar32 = 8;
LAB_00181b15:
      hints->max_contours = uVar32;
    }
  }
  else if ((uint)hints->max_contours < uVar32) {
    if ((anon_struct_7744_2_b586ae8f_for_embedded *)hints->contours == &hints->embedded) {
      hints->contours = (AF_Point_conflict *)0x0;
    }
    uVar32 = uVar32 + 3 & 0xfffffffc;
    ppAVar13 = (AF_Point_conflict *)
               ft_mem_realloc(memory,8,(ulong)(uint)hints->max_contours,(ulong)uVar32,
                              hints->contours,&local_7c);
    hints->contours = ppAVar13;
    if (local_7c != 0) {
      return local_7c;
    }
    goto LAB_00181b15;
  }
  sVar25 = local_78->n_points;
  uVar32 = (int)sVar25 + 2;
  if (uVar32 < 0x61) {
    if (hints->points != (AF_Point_conflict)0x0) goto LAB_00181b9a;
    hints->points = (hints->embedded).points;
    uVar32 = 0x60;
  }
  else {
    if (uVar32 <= (uint)hints->max_points) goto LAB_00181b9a;
    if (hints->points == (hints->embedded).points) {
      hints->points = (AF_Point_conflict)0x0;
    }
    uVar32 = (int)sVar25 + 0xbU & 0xfffffff8;
    pAVar14 = (AF_Point_conflict)
              ft_mem_realloc(memory,0x50,(ulong)(uint)hints->max_points,(ulong)uVar32,hints->points,
                             &local_7c);
    hints->points = pAVar14;
    if (local_7c != 0) {
      return local_7c;
    }
  }
  hints->max_points = uVar32;
LAB_00181b9a:
  hints->num_points = (int)local_78->n_points;
  hints->num_contours = (int)local_78->n_contours;
  hints->axis[0].major_dir = AF_DIR_UP;
  hints->axis[1].major_dir = AF_DIR_LEFT;
  FVar10 = FT_Outline_Get_Orientation(local_78);
  if (FVar10 == FT_ORIENTATION_FILL_LEFT) {
    hints->axis[0].major_dir = AF_DIR_DOWN;
    hints->axis[1].major_dir = AF_DIR_RIGHT;
  }
  hints->x_scale = FVar5;
  hints->y_scale = FVar6;
  hints->x_delta = (FT_Pos)local_68;
  hints->y_delta = local_50;
  hints->xmin_delta = 0;
  hints->xmax_delta = 0;
  iVar4 = hints->num_points;
  local_48 = (long)iVar4;
  if (local_48 != 0) {
    pAVar14 = hints->points;
    pAVar15 = pAVar14 + local_48;
    uVar32 = (uint)((hints->metrics->scaler).face)->units_per_EM * 0x14 >> 0xb;
    local_60 = (ulong)uVar32;
    psVar19 = local_78->contours;
    if (0 < iVar4) {
      pFVar7 = local_78->points;
      lVar26 = (long)*psVar19;
      pAVar33 = pAVar14 + lVar26;
      pbVar27 = (byte *)local_78->tags;
      local_38 = (long)(int)FVar5;
      local_40 = (long)(int)FVar6;
      iVar31 = 0;
      pFVar24 = pFVar7;
      pAVar18 = pAVar33;
      pAVar35 = pAVar14;
      do {
        pAVar35->in_dir = '\x04';
        pAVar35->out_dir = '\x04';
        FVar8 = pFVar24->x;
        pAVar35->fx = (FT_Short)FVar8;
        FVar9 = pFVar24->y;
        pAVar35->fy = (FT_Short)FVar9;
        lVar30 = (int)FVar8 * local_38;
        lVar30 = (long)(int)((ulong)(lVar30 + 0x8000 + (lVar30 >> 0x3f)) >> 0x10) + (long)local_68;
        pAVar35->x = lVar30;
        pAVar35->ox = lVar30;
        lVar30 = (int)FVar9 * local_40;
        lVar30 = (int)((ulong)(lVar30 + 0x8000 + (lVar30 >> 0x3f)) >> 0x10) + local_50;
        pAVar35->y = lVar30;
        pAVar35->oy = lVar30;
        pAVar33->fx = (FT_Short)pFVar7[(short)lVar26].x;
        pAVar33->fy = (FT_Short)pFVar7[(short)lVar26].y;
        FVar28 = (ushort)((*pbVar27 & 3) == 2) * 2;
        if ((*pbVar27 & 3) == 0) {
          FVar28 = 1;
        }
        pAVar35->flags = FVar28;
        uVar11 = (int)pAVar35->fx - (int)pAVar18->fx;
        uVar34 = -uVar11;
        if (0 < (int)uVar11) {
          uVar34 = uVar11;
        }
        uVar29 = (int)pAVar35->fy - (int)pAVar18->fy;
        uVar11 = -uVar29;
        if (0 < (int)uVar29) {
          uVar11 = uVar29;
        }
        if ((uVar11 & 0xffff) + (uVar34 & 0xffff) < uVar32) {
          *(byte *)&pAVar18->flags = (byte)pAVar18->flags | 0x20;
        }
        pAVar35->prev = pAVar18;
        pAVar18->next = pAVar35;
        pAVar18 = pAVar35;
        if ((pAVar35 == pAVar33) && (iVar31 = iVar31 + 1, iVar31 < local_78->n_contours)) {
          lVar26 = (long)psVar19[iVar31];
          pAVar33 = pAVar14 + lVar26;
          pAVar18 = pAVar33;
        }
        pAVar35 = pAVar35 + 1;
        pFVar24 = pFVar24 + 1;
        pbVar27 = pbVar27 + 1;
      } while (pAVar35 < pAVar15);
    }
    iVar31 = hints->num_contours;
    lVar26 = (long)iVar31;
    if (0 < lVar26) {
      ppAVar17 = hints->contours;
      ppAVar13 = ppAVar17 + lVar26;
      sVar25 = 0;
      do {
        *ppAVar17 = pAVar14 + sVar25;
        sVar25 = *psVar19 + 1;
        ppAVar17 = ppAVar17 + 1;
        psVar19 = psVar19 + 1;
      } while (ppAVar17 < ppAVar13);
    }
    if (0 < iVar31) {
      ppAVar13 = hints->contours;
      local_68 = ppAVar13 + lVar26;
      do {
        pAVar21 = *ppAVar13;
        do {
          pAVar18 = pAVar21;
          pAVar21 = pAVar18->prev;
          if (pAVar21 == *ppAVar13) break;
          uVar11 = (int)pAVar18->fx - (int)pAVar21->fx;
          uVar34 = -uVar11;
          if (0 < (int)uVar11) {
            uVar34 = uVar11;
          }
          uVar29 = (int)pAVar18->fy - (int)pAVar21->fy;
          uVar11 = -uVar29;
          if (0 < (int)uVar29) {
            uVar11 = uVar29;
          }
        } while ((long)((ulong)(uVar11 & 0xffff) + (ulong)(uVar34 & 0xffff)) <
                 (long)(int)(uVar32 * 2 + -1));
        pAVar18->u = 0;
        pAVar18->v = 0;
        lVar26 = 0;
        lVar30 = 0;
        pAVar16 = pAVar18;
        pAVar21 = pAVar18;
        do {
          pFVar1 = &pAVar21->fx;
          pFVar2 = &pAVar21->fy;
          pAVar21 = pAVar21->next;
          lVar26 = ((long)pAVar21->fx - (long)*pFVar1) + lVar26;
          lVar30 = ((long)pAVar21->fy - (long)*pFVar2) + lVar30;
          lVar22 = -lVar26;
          lVar20 = lVar26;
          if (lVar26 < 1) {
            lVar20 = lVar22;
          }
          lVar36 = lVar30;
          if (lVar30 < 1) {
            lVar36 = -lVar30;
          }
          if ((ulong)(lVar36 + lVar20) < local_60) {
            *(byte *)&pAVar21->flags = (byte)pAVar21->flags | 0x10;
          }
          else {
            lVar20 = (long)pAVar21 - (long)pAVar16 >> 4;
            pAVar16->u = lVar20 * -0x3333333333333333;
            pAVar21->v = lVar20 * 0x3333333333333333;
            if (lVar30 < lVar26) {
              bVar23 = 1;
              lVar20 = lVar26;
              if (SBORROW8(lVar30,lVar22) != lVar30 + lVar26 < 0) {
                bVar23 = 0xfe;
                lVar20 = -lVar30;
                lVar30 = lVar26;
              }
            }
            else {
              bVar37 = -lVar30 != lVar26;
              lVar20 = lVar30;
              if (bVar37 && lVar30 <= lVar22) {
                lVar26 = lVar30;
                lVar20 = lVar22;
              }
              bVar23 = -(bVar37 && lVar30 <= lVar22) | 2;
              lVar30 = lVar26;
            }
            lVar26 = -lVar30;
            if (0 < lVar30) {
              lVar26 = lVar30;
            }
            if (lVar20 <= lVar26 * 0xe) {
              bVar23 = 4;
            }
            while( true ) {
              pAVar16->out_dir = bVar23;
              pAVar16 = pAVar16->next;
              if (pAVar16 == pAVar21) break;
              pAVar16->in_dir = bVar23;
            }
            pAVar21->in_dir = bVar23;
            lVar26 = (long)pAVar18 - (long)pAVar16 >> 4;
            pAVar16->u = lVar26 * -0x3333333333333333;
            pAVar18->v = lVar26 * 0x3333333333333333;
            lVar26 = 0;
            lVar30 = 0;
          }
        } while (pAVar21 != pAVar18);
        ppAVar13 = ppAVar13 + 1;
      } while (ppAVar13 < local_68);
    }
    pAVar18 = pAVar14;
    if (0 < iVar4) {
      do {
        if ((((pAVar18->flags & 0x10) == 0) && (pAVar18->in_dir == '\x04')) &&
           (pAVar18->out_dir == '\x04')) {
          lVar26 = pAVar18->u;
          lVar30 = pAVar18->v;
          if ((-1 < ((int)pAVar18->fx - (int)pAVar18[lVar30].fx ^
                    (int)pAVar18[lVar26].fx - (int)pAVar18->fx)) &&
             (-1 < ((int)pAVar18->fy - (int)pAVar18[lVar30].fy ^
                   (int)pAVar18[lVar26].fy - (int)pAVar18->fy))) {
            pAVar18->flags = pAVar18->flags | 0x10;
            lVar20 = lVar26 * 0x50 + lVar30 * -0x50 >> 4;
            pAVar18[lVar30].u = lVar20 * -0x3333333333333333;
            pAVar18[lVar26].v = lVar20 * 0x3333333333333333;
          }
        }
        pAVar18 = pAVar18 + 1;
      } while (pAVar18 < pAVar15);
    }
    local_70 = pAVar14;
    local_58 = pAVar15;
    if (0 < iVar4) {
      do {
        if ((pAVar14->flags & 0x10) == 0) {
          if ((pAVar14->flags & 3) == 0) {
            cVar3 = pAVar14->out_dir;
            if (cVar3 == pAVar14->in_dir) {
              if (cVar3 == '\x04') {
                lVar26 = pAVar14->u;
                lVar30 = pAVar14->v;
                FVar12 = ft_corner_is_flat((long)pAVar14->fx - (long)pAVar14[lVar30].fx,
                                           (long)pAVar14->fy - (long)pAVar14[lVar30].fy,
                                           (long)pAVar14[lVar26].fx - (long)pAVar14->fx,
                                           (long)pAVar14[lVar26].fy - (long)pAVar14->fy);
                if (FVar12 == 0) goto LAB_00182092;
                lVar20 = lVar26 * 0x50 + lVar30 * -0x50 >> 4;
                pAVar14[lVar30].u = lVar20 * -0x3333333333333333;
                pAVar14[lVar26].v = lVar20 * 0x3333333333333333;
              }
            }
            else if ((int)pAVar14->in_dir + (int)cVar3 != 0) goto LAB_00182092;
          }
          *(byte *)&pAVar14->flags = (byte)pAVar14->flags | 0x10;
        }
LAB_00182092:
        pAVar14 = pAVar14 + 1;
      } while (pAVar14 < pAVar15);
    }
  }
  return local_7c;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_glyph_hints_reload( AF_GlyphHints  hints,
                         FT_Outline*    outline )
  {
    FT_Error   error   = FT_Err_Ok;
    AF_Point   points;
    FT_UInt    old_max, new_max;
    FT_Fixed   x_scale = hints->x_scale;
    FT_Fixed   y_scale = hints->y_scale;
    FT_Pos     x_delta = hints->x_delta;
    FT_Pos     y_delta = hints->y_delta;
    FT_Memory  memory  = hints->memory;


    hints->num_points   = 0;
    hints->num_contours = 0;

    hints->axis[0].num_segments = 0;
    hints->axis[0].num_edges    = 0;
    hints->axis[1].num_segments = 0;
    hints->axis[1].num_edges    = 0;

    /* first of all, reallocate the contours array if necessary */
    new_max = (FT_UInt)outline->n_contours;
    old_max = (FT_UInt)hints->max_contours;

    if ( new_max <= AF_CONTOURS_EMBEDDED )
    {
      if ( !hints->contours )
      {
        hints->contours     = hints->embedded.contours;
        hints->max_contours = AF_CONTOURS_EMBEDDED;
      }
    }
    else if ( new_max > old_max )
    {
      if ( hints->contours == hints->embedded.contours )
        hints->contours = NULL;

      new_max = ( new_max + 3 ) & ~3U; /* round up to a multiple of 4 */

      if ( FT_RENEW_ARRAY( hints->contours, old_max, new_max ) )
        goto Exit;

      hints->max_contours = (FT_Int)new_max;
    }

    /*
     *  then reallocate the points arrays if necessary --
     *  note that we reserve two additional point positions, used to
     *  hint metrics appropriately
     */
    new_max = (FT_UInt)( outline->n_points + 2 );
    old_max = (FT_UInt)hints->max_points;

    if ( new_max <= AF_POINTS_EMBEDDED )
    {
      if ( !hints->points )
      {
        hints->points     = hints->embedded.points;
        hints->max_points = AF_POINTS_EMBEDDED;
      }
    }
    else if ( new_max > old_max )
    {
      if ( hints->points == hints->embedded.points )
        hints->points = NULL;

      new_max = ( new_max + 2 + 7 ) & ~7U; /* round up to a multiple of 8 */

      if ( FT_RENEW_ARRAY( hints->points, old_max, new_max ) )
        goto Exit;

      hints->max_points = (FT_Int)new_max;
    }

    hints->num_points   = outline->n_points;
    hints->num_contours = outline->n_contours;

    /* We can't rely on the value of `FT_Outline.flags' to know the fill   */
    /* direction used for a glyph, given that some fonts are broken (e.g., */
    /* the Arphic ones).  We thus recompute it each time we need to.       */
    /*                                                                     */
    hints->axis[AF_DIMENSION_HORZ].major_dir = AF_DIR_UP;
    hints->axis[AF_DIMENSION_VERT].major_dir = AF_DIR_LEFT;

    if ( FT_Outline_Get_Orientation( outline ) == FT_ORIENTATION_POSTSCRIPT )
    {
      hints->axis[AF_DIMENSION_HORZ].major_dir = AF_DIR_DOWN;
      hints->axis[AF_DIMENSION_VERT].major_dir = AF_DIR_RIGHT;
    }

    hints->x_scale = x_scale;
    hints->y_scale = y_scale;
    hints->x_delta = x_delta;
    hints->y_delta = y_delta;

    hints->xmin_delta = 0;
    hints->xmax_delta = 0;

    points = hints->points;
    if ( hints->num_points == 0 )
      goto Exit;

    {
      AF_Point  point;
      AF_Point  point_limit = points + hints->num_points;

      /* value 20 in `near_limit' is heuristic */
      FT_UInt  units_per_em = hints->metrics->scaler.face->units_per_EM;
      FT_Int   near_limit   = 20 * units_per_em / 2048;


      /* compute coordinates & Bezier flags, next and prev */
      {
        FT_Vector*  vec           = outline->points;
        char*       tag           = outline->tags;
        FT_Short    endpoint      = outline->contours[0];
        AF_Point    end           = points + endpoint;
        AF_Point    prev          = end;
        FT_Int      contour_index = 0;


        for ( point = points; point < point_limit; point++, vec++, tag++ )
        {
          FT_Pos  out_x, out_y;


          point->in_dir  = (FT_Char)AF_DIR_NONE;
          point->out_dir = (FT_Char)AF_DIR_NONE;

          point->fx = (FT_Short)vec->x;
          point->fy = (FT_Short)vec->y;
          point->ox = point->x = FT_MulFix( vec->x, x_scale ) + x_delta;
          point->oy = point->y = FT_MulFix( vec->y, y_scale ) + y_delta;

          end->fx = (FT_Short)outline->points[endpoint].x;
          end->fy = (FT_Short)outline->points[endpoint].y;

          switch ( FT_CURVE_TAG( *tag ) )
          {
          case FT_CURVE_TAG_CONIC:
            point->flags = AF_FLAG_CONIC;
            break;
          case FT_CURVE_TAG_CUBIC:
            point->flags = AF_FLAG_CUBIC;
            break;
          default:
            point->flags = AF_FLAG_NONE;
          }

          out_x = point->fx - prev->fx;
          out_y = point->fy - prev->fy;

          if ( FT_ABS( out_x ) + FT_ABS( out_y ) < near_limit )
            prev->flags |= AF_FLAG_NEAR;

          point->prev = prev;
          prev->next  = point;
          prev        = point;

          if ( point == end )
          {
            if ( ++contour_index < outline->n_contours )
            {
              endpoint = outline->contours[contour_index];
              end      = points + endpoint;
              prev     = end;
            }
          }
        }
      }

      /* set up the contours array */
      {
        AF_Point*  contour       = hints->contours;
        AF_Point*  contour_limit = contour + hints->num_contours;
        short*     end           = outline->contours;
        short      idx           = 0;


        for ( ; contour < contour_limit; contour++, end++ )
        {
          contour[0] = points + idx;
          idx        = (short)( end[0] + 1 );
        }
      }

      {
        /*
         *  Compute directions of `in' and `out' vectors.
         *
         *  Note that distances between points that are very near to each
         *  other are accumulated.  In other words, the auto-hinter either
         *  prepends the small vectors between near points to the first
         *  non-near vector, or the sum of small vector lengths exceeds a
         *  threshold, thus `grouping' the small vectors.  All intermediate
         *  points are tagged as weak; the directions are adjusted also to
         *  be equal to the accumulated one.
         */

        FT_Int  near_limit2 = 2 * near_limit - 1;

        AF_Point*  contour;
        AF_Point*  contour_limit = hints->contours + hints->num_contours;


        for ( contour = hints->contours; contour < contour_limit; contour++ )
        {
          AF_Point  first = *contour;
          AF_Point  next, prev, curr;

          FT_Pos  out_x, out_y;


          /* since the first point of a contour could be part of a */
          /* series of near points, go backwards to find the first */
          /* non-near point and adjust `first'                     */

          point = first;
          prev  = first->prev;

          while ( prev != first )
          {
            out_x = point->fx - prev->fx;
            out_y = point->fy - prev->fy;

            /*
             *  We use Taxicab metrics to measure the vector length.
             *
             *  Note that the accumulated distances so far could have the
             *  opposite direction of the distance measured here.  For this
             *  reason we use `near_limit2' for the comparison to get a
             *  non-near point even in the worst case.
             */
            if ( FT_ABS( out_x ) + FT_ABS( out_y ) >= near_limit2 )
              break;

            point = prev;
            prev  = prev->prev;
          }

          /* adjust first point */
          first = point;

          /* now loop over all points of the contour to get */
          /* `in' and `out' vector directions               */

          curr = first;

          /*
           *  We abuse the `u' and `v' fields to store index deltas to the
           *  next and previous non-near point, respectively.
           *
           *  To avoid problems with not having non-near points, we point to
           *  `first' by default as the next non-near point.
           *
           */
          curr->u  = (FT_Pos)( first - curr );
          first->v = -curr->u;

          out_x = 0;
          out_y = 0;

          next = first;
          do
          {
            AF_Direction  out_dir;


            point = next;
            next  = point->next;

            out_x += next->fx - point->fx;
            out_y += next->fy - point->fy;

            if ( FT_ABS( out_x ) + FT_ABS( out_y ) < near_limit )
            {
              next->flags |= AF_FLAG_WEAK_INTERPOLATION;
              continue;
            }

            curr->u = (FT_Pos)( next - curr );
            next->v = -curr->u;

            out_dir = af_direction_compute( out_x, out_y );

            /* adjust directions for all points inbetween; */
            /* the loop also updates position of `curr'    */
            curr->out_dir = (FT_Char)out_dir;
            for ( curr = curr->next; curr != next; curr = curr->next )
            {
              curr->in_dir  = (FT_Char)out_dir;
              curr->out_dir = (FT_Char)out_dir;
            }
            next->in_dir = (FT_Char)out_dir;

            curr->u  = (FT_Pos)( first - curr );
            first->v = -curr->u;

            out_x = 0;
            out_y = 0;

          } while ( next != first );
        }

        /*
         *  The next step is to `simplify' an outline's topology so that we
         *  can identify local extrema more reliably: A series of
         *  non-horizontal or non-vertical vectors pointing into the same
         *  quadrant are handled as a single, long vector.  From a
         *  topological point of the view, the intermediate points are of no
         *  interest and thus tagged as weak.
         */

        for ( point = points; point < point_limit; point++ )
        {
          if ( point->flags & AF_FLAG_WEAK_INTERPOLATION )
            continue;

          if ( point->in_dir  == AF_DIR_NONE &&
               point->out_dir == AF_DIR_NONE )
          {
            /* check whether both vectors point into the same quadrant */

            FT_Pos  in_x, in_y;
            FT_Pos  out_x, out_y;

            AF_Point  next_u = point + point->u;
            AF_Point  prev_v = point + point->v;


            in_x = point->fx - prev_v->fx;
            in_y = point->fy - prev_v->fy;

            out_x = next_u->fx - point->fx;
            out_y = next_u->fy - point->fy;

            if ( ( in_x ^ out_x ) >= 0 && ( in_y ^ out_y ) >= 0 )
            {
              /* yes, so tag current point as weak */
              /* and update index deltas           */

              point->flags |= AF_FLAG_WEAK_INTERPOLATION;

              prev_v->u = (FT_Pos)( next_u - prev_v );
              next_u->v = -prev_v->u;
            }
          }
        }

        /*
         *  Finally, check for remaining weak points.  Everything else not
         *  collected in edges so far is then implicitly classified as strong
         *  points.
         */

        for ( point = points; point < point_limit; point++ )
        {
          if ( point->flags & AF_FLAG_WEAK_INTERPOLATION )
            continue;

          if ( point->flags & AF_FLAG_CONTROL )
          {
            /* control points are always weak */
          Is_Weak_Point:
            point->flags |= AF_FLAG_WEAK_INTERPOLATION;
          }
          else if ( point->out_dir == point->in_dir )
          {
            if ( point->out_dir != AF_DIR_NONE )
            {
              /* current point lies on a horizontal or          */
              /* vertical segment (but doesn't start or end it) */
              goto Is_Weak_Point;
            }

            {
              AF_Point  next_u = point + point->u;
              AF_Point  prev_v = point + point->v;


              if ( ft_corner_is_flat( point->fx  - prev_v->fx,
                                      point->fy  - prev_v->fy,
                                      next_u->fx - point->fx,
                                      next_u->fy - point->fy ) )
              {
                /* either the `in' or the `out' vector is much more  */
                /* dominant than the other one, so tag current point */
                /* as weak and update index deltas                   */

                prev_v->u = (FT_Pos)( next_u - prev_v );
                next_u->v = -prev_v->u;

                goto Is_Weak_Point;
              }
            }
          }
          else if ( point->in_dir == -point->out_dir )
          {
            /* current point forms a spike */
            goto Is_Weak_Point;
          }
        }
      }
    }

  Exit:
    return error;
  }